

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-component.c
# Opt level: O2

void name_component_print(name_component_t *component)

{
  uint32_t uVar1;
  ndn_time_us_t nVar2;
  char *__format;
  int j;
  ulong uVar3;
  
  uVar1 = component->type;
  if (uVar1 == 0x25) {
    nVar2 = name_component_to_sequence_num(component);
    __format = "/seq=%lu";
  }
  else {
    if (uVar1 == 2) {
      printf("/params-sha256=0x");
      for (uVar3 = 0; uVar3 < component->size; uVar3 = uVar3 + 1) {
        printf("%02x",(ulong)component->value[uVar3]);
      }
      return;
    }
    if (uVar1 == 0x23) {
      nVar2 = name_component_to_version(component);
      __format = "/v=%lu";
    }
    else {
      if (uVar1 != 0x24) {
        if (uVar1 == 1) {
          printf("/sha256digiest=0x");
          for (uVar3 = 0; uVar3 < component->size; uVar3 = uVar3 + 1) {
            printf("%02x",(ulong)component->value[uVar3]);
          }
          return;
        }
        putchar(0x2f);
        for (uVar3 = 0; uVar3 < component->size; uVar3 = uVar3 + 1) {
          if ((byte)(component->value[uVar3] - 0x21) < 0x5d) {
            putchar((uint)component->value[uVar3]);
          }
          else {
            printf("0x%02x");
          }
        }
        return;
      }
      nVar2 = name_component_to_timestamp(component);
      __format = "/t=%lu";
    }
  }
  printf(__format,nVar2);
  return;
}

Assistant:

void
name_component_print(const name_component_t* component)
{
  switch (component->type) {
    case TLV_ImplicitSha256DigestComponent:
      printf("/sha256digiest=0x");
      for (int j = 0; j < component->size; j++) {
        printf("%02x", component->value[j]);
      }
      break;

    case TLV_ParametersSha256DigestComponent:
      printf("/params-sha256=0x");
      for (int j = 0; j < component->size; j++) {
        printf("%02x", component->value[j]);
      }
      break;

    case TLV_VersionNameComponent:
      printf("/v=%" PRIu64 "", name_component_to_version(component));
      break;

    case TLV_TimestampNameComponent:
      printf("/t=%" PRI_ndn_time_us_t "", name_component_to_timestamp(component));
      break;

    case TLV_SequenceNumNameComponent:
      printf("/seq=%" PRIu64 "", name_component_to_sequence_num(component));
      break;

    default:
      printf("/");
      for (int j = 0; j < component->size; j++) {
        if (component->value[j] >= 33 && component->value[j] < 126) {
          printf("%c", component->value[j]);
        }
        else {
          printf("0x%02x", component->value[j]);
        }
      }
      break;
  }
}